

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darPrec.c
# Opt level: O2

uint Dar_TruthPermute(uint Truth,char *pPerms,int nVars,int fReverse)

{
  int *pMints;
  int *pMintsP;
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  if (nVars < 6) {
    uVar3 = 1 << ((byte)nVars & 0x1f);
    uVar4 = (ulong)uVar3;
    pMints = (int *)malloc(uVar4 * 4);
    pMintsP = (int *)malloc(uVar4 * 4);
    for (uVar1 = 0; uVar4 != uVar1; uVar1 = uVar1 + 1) {
      pMints[uVar1] = (int)uVar1;
    }
    Dar_TruthPermute_int(pMints,uVar3,pPerms,nVars,pMintsP);
    if (fReverse == 0) {
      uVar3 = 0;
      for (uVar1 = 0; uVar4 != uVar1; uVar1 = uVar1 + 1) {
        if ((Truth >> ((uint)uVar1 & 0x1f) & 1) != 0) {
          uVar3 = uVar3 | 1 << (*(byte *)(pMintsP + uVar1) & 0x1f);
        }
      }
    }
    else {
      uVar3 = 0;
      for (uVar1 = 0; uVar4 != uVar1; uVar1 = uVar1 + 1) {
        uVar2 = 1 << ((byte)uVar1 & 0x1f);
        if ((Truth >> (pMintsP[uVar1] & 0x1fU) & 1) == 0) {
          uVar2 = 0;
        }
        uVar3 = uVar3 | uVar2;
      }
    }
    free(pMints);
    free(pMintsP);
    return uVar3;
  }
  __assert_fail("nVars < 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darPrec.c"
                ,0xd6,"unsigned int Dar_TruthPermute(unsigned int, char *, int, int)");
}

Assistant:

unsigned Dar_TruthPermute( unsigned Truth, char * pPerms, int nVars, int fReverse )
{
    unsigned Result;
    int * pMints;
    int * pMintsP;
    int nMints;
    int i, m;

    assert( nVars < 6 );
    nMints  = (1 << nVars);
    pMints  = ABC_ALLOC( int, nMints );
    pMintsP = ABC_ALLOC( int, nMints );
    for ( i = 0; i < nMints; i++ )
        pMints[i] = i;

    Dar_TruthPermute_int( pMints, nMints, pPerms, nVars, pMintsP );

    Result = 0;
    if ( fReverse )
    {
        for ( m = 0; m < nMints; m++ )
            if ( Truth & (1 << pMintsP[m]) )
                Result |= (1 << m);
    }
    else
    {
        for ( m = 0; m < nMints; m++ )
            if ( Truth & (1 << m) )
                Result |= (1 << pMintsP[m]);
    }

    ABC_FREE( pMints );
    ABC_FREE( pMintsP );

    return Result;
}